

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_awaiter.hxx
# Opt level: O2

void __thiscall nuraft::EventAwaiter::invoke(EventAwaiter *this)

{
  bool bVar1;
  AS expected;
  unique_lock<std::mutex> l;
  
  expected = idle;
  bVar1 = std::atomic<nuraft::EventAwaiter::AS>::compare_exchange_strong
                    (&this->status,&expected,done,memory_order_seq_cst);
  if (!bVar1) {
    std::unique_lock<std::mutex>::unique_lock(&l,&this->cvLock);
    expected = ready;
    bVar1 = std::atomic<nuraft::EventAwaiter::AS>::compare_exchange_strong
                      (&this->status,&expected,done,memory_order_seq_cst);
    if (!bVar1) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::~unique_lock(&l);
  }
  return;
}

Assistant:

void invoke() {
        AS expected = AS::idle;
        if (status.compare_exchange_strong(expected, AS::done)) {
            // wait() has not been invoked yet, do nothing.
            return;
        }

        std::unique_lock<std::mutex> l(cvLock);
        expected = AS::ready;
        if (status.compare_exchange_strong(expected, AS::done)) {
            // wait() has been called earlier than invoke(),
            // but invoke() has grabbed `cvLock` earlier than wait().
            // Do nothing.
        } else {
            // wait() is waiting for ack.
            cv.notify_all();
        }
    }